

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

bool __thiscall
testing::internal::
OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
::Matches(OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
          *this,ArgumentTuple *args)

{
  bool bVar1;
  bool local_19;
  ArgumentTuple *args_local;
  OnCallSpec<ot::commissioner::Error_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short)>
  *this_local;
  
  bVar1 = TupleMatches<std::tuple<testing::Matcher<std::__cxx11::string_const&>,testing::Matcher<unsigned_short>>,std::tuple<std::__cxx11::string_const&,unsigned_short>>
                    ((tuple<testing::Matcher<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&>,_testing::Matcher<unsigned_short>_>
                      *)(this + 0x10),args);
  local_19 = false;
  if (bVar1) {
    local_19 = MatcherBase<const_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short>_&>
               ::Matches((MatcherBase<const_std::tuple<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_unsigned_short>_&>
                          *)(this + 0x40),args);
  }
  return local_19;
}

Assistant:

bool Matches(const ArgumentTuple& args) const {
    return TupleMatches(matchers_, args) && extra_matcher_.Matches(args);
  }